

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArraySamplingTest::getSamplingComputeShaderCode
          (TextureCubeMapArraySamplingTest *this,samplerType *sampler_type,
          samplingFunction *sampling_function,string *out_compute_shader_code)

{
  samplingFunction sampling_function_00;
  samplerType sVar1;
  char cVar2;
  int iVar3;
  bool bVar4;
  GLchar *pGVar5;
  int iVar6;
  size_t sVar7;
  ostream *poVar8;
  GLuint n_components;
  char *pcVar9;
  char *__s;
  long lVar10;
  attributeDefinition *paVar11;
  char *__s_00;
  char *local_218;
  string sampling_code;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream stream;
  undefined1 local_1a8 [376];
  
  sampling_code._M_dataplus._M_p = (pointer)&sampling_code.field_2;
  sampling_code._M_string_length = 0;
  sampling_code.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  sampling_function_00 = *sampling_function;
  n_components = 0;
  switch(sampling_function_00) {
  case Texture:
    paVar11 = getAttributes::texture_attributes;
    goto LAB_00d66dc7;
  case TextureLod:
    paVar11 = getAttributes::textureLod_attributes;
    iVar6 = 2;
    break;
  case TextureGrad:
    paVar11 = getAttributes::textureGrad_attributes;
    iVar6 = 3;
    break;
  case TextureGather:
    paVar11 = getAttributes::textureGather_attributes;
LAB_00d66dc7:
    iVar6 = 1;
    break;
  default:
    bVar4 = false;
    iVar6 = 0;
    paVar11 = (attributeDefinition *)0x0;
    goto LAB_00d66de6;
  }
  bVar4 = true;
LAB_00d66de6:
  sVar1 = *sampler_type;
  switch(sVar1) {
  case Float:
    __s_00 = "samplerCubeArray ";
    n_components = 4;
    pcVar9 = "rgba8";
    __s = "image2D ";
    local_218 = "vec4 ";
    break;
  case Int:
    __s_00 = "isamplerCubeArray ";
    n_components = 4;
    pcVar9 = "rgba32i";
    __s = "iimage2D ";
    local_218 = "ivec4 ";
    break;
  case UInt:
    __s_00 = "usamplerCubeArray ";
    n_components = 4;
    pcVar9 = "rgba32ui";
    __s = "uimage2D ";
    local_218 = "uvec4 ";
    break;
  case Depth:
    n_components = 1;
    local_218 = "float ";
    getShadowSamplingFunctionCall
              ((TextureCubeMapArraySamplingTest *)0x1a5bd2f,sampling_function_00,"float ",1,"cs_",
               (GLchar *)0x0,"color",(GLchar *)0x0,"sampler",&sampling_code);
    __s = "image2D ";
    pcVar9 = "rgba8";
    __s_00 = "samplerCubeArrayShadow ";
    goto LAB_00d66f56;
  case Stencil:
    __s_00 = "usamplerCubeArray ";
    n_components = 1;
    pcVar9 = "r32ui";
    __s = "uimage2D ";
    local_218 = "uint ";
    break;
  default:
    local_218 = (GLchar *)0x0;
    __s = (char *)0x0;
    pcVar9 = (char *)0x0;
    __s_00 = (char *)0x0;
  }
  getSamplingFunctionCall
            ((TextureCubeMapArraySamplingTest *)0x1a5bd2f,sampling_function_00,local_218,
             n_components,"cs_",(GLchar *)0x0,"color",(GLchar *)0x0,"sampler",&sampling_code);
LAB_00d66f56:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"${VERSION}\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"precision highp float;\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"/* Sampling compute shader */",0x1d);
  cVar2 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"uniform ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"highp ",6);
  iVar3 = (int)(ostream *)local_1a8;
  if (__s_00 == (char *)0x0) {
    std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar7 = strlen(__s_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s_00,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"sampler",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";",1);
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"layout(",7);
  if (pcVar9 == (char *)0x0) {
    std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar7 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,") ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"uniform ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"writeonly ",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"highp ",6);
  if (__s == (char *)0x0) {
    std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar7 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"image",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";",1);
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  if (bVar4) {
    lVar10 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(std430, binding=",0x17);
      poVar8 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)local_1a8,*(int *)((long)&paVar11->binding + lVar10));
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,") buffer ",9);
      pcVar9 = *(char **)((long)&paVar11->name + lVar10);
      if (pcVar9 == (char *)0x0) {
        std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
      }
      else {
        sVar7 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar7);
      }
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
      pcVar9 = *(char **)((long)&paVar11->type + lVar10);
      if (pcVar9 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar7 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      pcVar9 = *(char **)((long)&paVar11->name + lVar10);
      if (pcVar9 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar7 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_data[];\n",9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"};\n",3);
      lVar10 = lVar10 + 0x18;
    } while ((ulong)(iVar6 + (uint)(iVar6 == 0)) * 0x18 != lVar10);
  }
  if (sVar1 == Depth) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(std430, binding=",0x17);
    poVar8 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)local_1a8,getAttributes::depth_attributes[0].binding);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") buffer ",9);
    pGVar5 = getAttributes::depth_attributes[0].name;
    if (getAttributes::depth_attributes[0].name == (GLchar *)0x0) {
      std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
    }
    else {
      sVar7 = strlen(getAttributes::depth_attributes[0].name);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pGVar5,sVar7);
    }
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
    pGVar5 = getAttributes::depth_attributes[0].type;
    if (getAttributes::depth_attributes[0].type == (GLchar *)0x0) {
      std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar7 = strlen(getAttributes::depth_attributes[0].type);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pGVar5,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
    pGVar5 = getAttributes::depth_attributes[0].name;
    if (getAttributes::depth_attributes[0].name == (GLchar *)0x0) {
      std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar7 = strlen(getAttributes::depth_attributes[0].name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pGVar5,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_data[];\n",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"};\n",3);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n",0x42);
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "void main()\n{\n    const int face_width         = 3;\n    const int face_height        = 3;\n    const int vertices_per_face  = face_width * face_height;\n    const int faces_per_layer    = 6;\n    const int layer_width        = faces_per_layer * face_width;\n    const int vertices_per_layer = vertices_per_face * faces_per_layer;\n\n    ivec2 image_coord            = ivec2(gl_WorkGroupID.xy);\n    ivec3 texture_size           = textureSize(sampler, 0);\n\n    int layer                    = image_coord.x / layer_width;\n    int layer_offset             = layer * layer_width;\n    int layer_index              = layer * vertices_per_layer;\n    int face                     = (image_coord.x - layer_offset) / face_width;\n    int face_offset              = face * face_width;\n    int face_index               = face * vertices_per_face;\n    int vertex                   = image_coord.x - layer_offset - face_offset;\n    int vertex_index             = layer_index + face_index + vertex + (face_height - image_coord.y - 1) * face_width;\n\n"
             ,0x402);
  if (bVar4) {
    lVar10 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
      pcVar9 = *(char **)((long)&paVar11->type + lVar10);
      if (pcVar9 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar7 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"cs_",3);
      pcVar9 = *(char **)((long)&paVar11->name + lVar10);
      if (pcVar9 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar7 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
      pcVar9 = *(char **)((long)&paVar11->name + lVar10);
      if (pcVar9 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar7 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"_data[vertex_index];",0x14);
      std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      lVar10 = lVar10 + 0x18;
    } while ((ulong)(iVar6 + (uint)(iVar6 == 0)) * 0x18 != lVar10);
  }
  if (sVar1 == Depth) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
    pGVar5 = getAttributes::depth_attributes[0].type;
    if (getAttributes::depth_attributes[0].type == (GLchar *)0x0) {
      std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar7 = strlen(getAttributes::depth_attributes[0].type);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pGVar5,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"cs_",3);
    pGVar5 = getAttributes::depth_attributes[0].name;
    if (getAttributes::depth_attributes[0].name == (GLchar *)0x0) {
      std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar7 = strlen(getAttributes::depth_attributes[0].name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pGVar5,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
    pGVar5 = getAttributes::depth_attributes[0].name;
    if (getAttributes::depth_attributes[0].name == (GLchar *)0x0) {
      std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar7 = strlen(getAttributes::depth_attributes[0].name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pGVar5,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"_data[vertex_index];",0x14);
    std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
  }
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  poVar8 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    ",4);
  if (local_218 == (char *)0x0) {
    std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
  }
  else {
    sVar7 = strlen(local_218);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_218,sVar7);
  }
  pcVar9 = "color";
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"color",5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,";",1);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  poVar8 = (ostream *)std::ostream::flush();
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,sampling_code._M_dataplus._M_p,sampling_code._M_string_length);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    imageStore(image, image_coord, ",0x23);
  if (n_components == 4) {
    lVar10 = 5;
  }
  else {
    if (n_components != 1) goto LAB_00d679c3;
    if (*sampler_type == Depth) {
      lVar10 = 5;
      pcVar9 = "vec4(";
    }
    else {
      if (*sampler_type != Stencil) goto LAB_00d679c3;
      lVar10 = 6;
      pcVar9 = "uvec4(";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,lVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"color",5);
    lVar10 = 1;
    pcVar9 = ")";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,lVar10);
LAB_00d679c3:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,");\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)out_compute_shader_code,(string *)local_1d8);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sampling_code._M_dataplus._M_p != &sampling_code.field_2) {
    operator_delete(sampling_code._M_dataplus._M_p,
                    CONCAT71(sampling_code.field_2._M_allocated_capacity._1_7_,
                             sampling_code.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::getSamplingComputeShaderCode(const samplerType&	  sampler_type,
																   const samplingFunction& sampling_function,
																   std::string&			   out_compute_shader_code)
{
	const glw::GLchar*		   color_type					 = 0;
	const glw::GLchar*		   image_type_str				 = 0;
	const glw::GLchar*		   image_layout_str				 = 0;
	const glw::GLchar*		   interpolation_type			 = 0;
	bool					   is_shadow_sampler			 = false;
	glw::GLuint				   n_components					 = 0;
	glw::GLuint				   n_routine_attributes			 = 0;
	glw::GLuint				   n_type_attributes			 = 0;
	const attributeDefinition* routine_attribute_definitions = 0;
	const attributeDefinition* type_attribute_definitions	= 0;
	const glw::GLchar*		   sampler_type_str				 = 0;
	std::string				   sampling_code;
	std::stringstream		   stream;

	/* Get attributes for sampling function */
	getAttributes(sampling_function, routine_attribute_definitions, n_routine_attributes);
	getAttributes(sampler_type, type_attribute_definitions, n_type_attributes);

	/* Get type for color variables */
	getColorType(sampler_type, color_type, interpolation_type, sampler_type_str, image_type_str, image_layout_str,
				 n_components, is_shadow_sampler);

	/* Get sampling code */
	if (false == is_shadow_sampler)
	{
		getSamplingFunctionCall(sampling_function, color_type, n_components, compute_shader_param, 0,
								compute_shader_color, 0, sampler_name, sampling_code);
	}
	else
	{
		getShadowSamplingFunctionCall(sampling_function, color_type, n_components, compute_shader_param, 0,
									  compute_shader_color, 0, sampler_name, sampling_code);
	}

	/* Preamble */
	stream << shader_code_preamble << shader_precision << "/* Sampling compute shader */" << std::endl;

	/* uniform samplerType sampler */
	stream << shader_uniform << "highp " << sampler_type_str << sampler_name << ";" << std::endl;

	/* uniform writeonly image2D image*/
	stream << "layout(" << image_layout_str << ") " << shader_uniform << shader_writeonly << "highp " << image_type_str
		   << image_name << ";" << std::endl;

	/* layout(shared) buffer attribute { type attribute_data[]; }; */
	for (glw::GLuint i = 0; i < n_routine_attributes; ++i)
	{
		stream << compute_shader_layout_binding << routine_attribute_definitions[i].binding << compute_shader_buffer
			   << routine_attribute_definitions[i].name << std::endl;

		stream << "{\n";
		stream << "    " << routine_attribute_definitions[i].type << " " << routine_attribute_definitions[i].name
			   << "_data[];\n";
		stream << "};\n";
	}
	for (glw::GLuint i = 0; i < n_type_attributes; ++i)
	{
		stream << compute_shader_layout_binding << type_attribute_definitions[i].binding << compute_shader_buffer
			   << type_attribute_definitions[i].name << std::endl;

		stream << "{\n";
		stream << "    " << type_attribute_definitions[i].type << " " << type_attribute_definitions[i].name
			   << "_data[];\n";
		stream << "};\n";
	}

	/* layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in; */
	stream << compute_shader_layout << std::endl;

	/* main + body */
	stream << compute_shader_body;

	/* type cs_attribute = attribute_data[vertex_index] */
	for (glw::GLuint i = 0; i < n_routine_attributes; ++i)
	{
		stream << "    " << routine_attribute_definitions[i].type << compute_shader_param
			   << routine_attribute_definitions[i].name << " = " << routine_attribute_definitions[i].name
			   << "_data[vertex_index];" << std::endl;
	}
	for (glw::GLuint i = 0; i < n_type_attributes; ++i)
	{
		stream << "    " << type_attribute_definitions[i].type << compute_shader_param
			   << type_attribute_definitions[i].name << " = " << type_attribute_definitions[i].name
			   << "_data[vertex_index];" << std::endl;
	}

	/* type color */
	stream << std::endl << "    " << color_type << compute_shader_color << ";" << std::endl;

	/* color = texture*/
	stream << std::endl << sampling_code << std::endl;
	//stream << std::endl << compute_shader_color << " = vec4(cs_grad_x, 255.0);" << std::endl;

	/* imageStore */
	stream << compute_shader_image_store;
	switch (n_components)
	{
	case 1:
		/* imageStore(image, image_coord, color.r);*/
		if (sampler_type == Depth)
		{
			stream << "vec4(" << compute_shader_color << ")";
		}
		else if (sampler_type == Stencil)
		{
			stream << "uvec4(" << compute_shader_color << ")";
		}
		else
		{
			// unexpected case
			DE_ASSERT(false);
		}
		break;
	case 4:
		/* imageStore(image, image_coord, color);*/
		stream << compute_shader_color;
		break;
	};

	stream << ");\n";

	stream << "}\n" << std::endl;

	out_compute_shader_code = stream.str();
}